

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::HasWeakFields(Descriptor *descriptor,Options *options)

{
  long lVar1;
  ulong uVar2;
  LogMessage *other;
  long *plVar3;
  ulong uVar4;
  bool bVar5;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar2 = (ulong)*(int *)(descriptor + 4);
  if ((long)uVar2 < 1) {
LAB_0023e01e:
    bVar5 = false;
  }
  else {
    bVar5 = true;
    if (*(char *)(*(long *)(*(long *)(descriptor + 0x28) + 0x38) + 0x4f) == '\0') {
      plVar3 = (long *)(*(long *)(descriptor + 0x28) + 0x80);
      uVar4 = 0;
      do {
        if (uVar2 - 1 == uVar4) goto LAB_0023e01e;
        lVar1 = *plVar3;
        plVar3 = plVar3 + 9;
        uVar4 = uVar4 + 1;
      } while (*(char *)(lVar1 + 0x4f) != '\x01');
      bVar5 = uVar4 < uVar2;
    }
    if (options->opensource_runtime == true) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                 ,0x138);
      other = internal::LogMessage::operator<<
                        (&local_48,"CHECK failed: !options.opensource_runtime: ");
      internal::LogFinisher::operator=(&local_49,other);
      internal::LogMessage::~LogMessage(&local_48);
    }
  }
  return bVar5;
}

Assistant:

bool HasWeakFields(const Descriptor* descriptor, const Options& options) {
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (IsWeak(descriptor->field(i), options)) return true;
  }
  return false;
}